

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valueimpl.hpp
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
camp::detail::
ConvertVisitor<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
operator()(void)

{
  BadType *__return_storage_ptr__;
  allocator local_a2;
  allocator local_a1;
  string local_a0;
  string local_80;
  BadType local_60;
  
  __return_storage_ptr__ = (BadType *)__cxa_allocate_exception(0x48);
  BadType::BadType(&local_60,noType,stringType);
  std::__cxx11::string::string
            ((string *)&local_80,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/fw4spl-org[P]camp/include/camp/detail/valueimpl.hpp"
             ,&local_a1);
  std::__cxx11::string::string
            ((string *)&local_a0,
             "T camp::detail::ConvertVisitor<std::basic_string<char>>::operator()(NoType) const [T = std::basic_string<char>]"
             ,&local_a2);
  Error::prepare<camp::BadType>(__return_storage_ptr__,&local_60,&local_80,0x44,&local_a0);
  __cxa_throw(__return_storage_ptr__,&BadType::typeinfo,Error::~Error);
}

Assistant:

T operator()(NoType) const
    {
        // Error: trying to convert an empty value
        CAMP_ERROR(BadType(noType, mapType<T>()));
    }